

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O0

void ecdh_init_internal(mbedtls_ecdh_context_mbed *ctx)

{
  mbedtls_ecdh_context_mbed *ctx_local;
  
  mbedtls_ecp_group_init(&ctx->grp);
  mbedtls_mpi_init(&ctx->d);
  mbedtls_ecp_point_init(&ctx->Q);
  mbedtls_ecp_point_init(&ctx->Qp);
  mbedtls_mpi_init(&ctx->z);
  return;
}

Assistant:

static void ecdh_init_internal(mbedtls_ecdh_context_mbed *ctx)
{
    mbedtls_ecp_group_init(&ctx->grp);
    mbedtls_mpi_init(&ctx->d);
    mbedtls_ecp_point_init(&ctx->Q);
    mbedtls_ecp_point_init(&ctx->Qp);
    mbedtls_mpi_init(&ctx->z);

#if defined(MBEDTLS_ECP_RESTARTABLE)
    mbedtls_ecp_restart_init(&ctx->rs);
#endif
}